

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O0

void __thiscall
llbuild::basic::FileChecksumHasher::readPathStringAndDigest
          (FileChecksumHasher *this,FileChecksum *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FileChecksum *result_local;
  FileChecksumHasher *this_local;
  
  uVar1 = std::__cxx11::string::operator[]((ulong)this->path);
  uVar2 = std::__cxx11::string::size();
  (*this->_vptr_FileChecksumHasher[3])(this,uVar1,uVar2);
  (*this->_vptr_FileChecksumHasher[2])();
  (**this->_vptr_FileChecksumHasher)(this,result);
  return;
}

Assistant:

virtual void readPathStringAndDigest(FileChecksum& result) {
    update(reinterpret_cast<const uint8_t*>(&path[0]), path.size());
    finalize();
    copy(result.bytes);
  }